

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O3

MatrixOrder __thiscall
deqp::gles31::Functional::anon_unknown_0::getMatrixOrderFromPath
          (anon_unknown_0 *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path)

{
  MatrixOrder MVar1;
  uint uVar2;
  ulong uVar3;
  anon_unknown_0 *paVar4;
  
  uVar2 = (uint)((ulong)((long)path - (long)this) >> 4);
  if ((int)uVar2 < 1) {
    return MATRIXORDER_LAST;
  }
  uVar3 = (ulong)(uVar2 & 0x7fffffff);
  paVar4 = this + 8;
  MVar1 = MATRIXORDER_LAST;
  do {
    if (*(int *)paVar4 - 1U < 2) {
      if (*(MatrixOrder *)(*(long *)(paVar4 + -8) + 0x10) != MATRIXORDER_LAST) {
        MVar1 = *(MatrixOrder *)(*(long *)(paVar4 + -8) + 0x10);
      }
    }
    else if (*(int *)paVar4 != 0) {
      return MATRIXORDER_LAST;
    }
    paVar4 = paVar4 + 0x10;
    uVar3 = uVar3 - 1;
  } while (uVar3 != 0);
  return MVar1;
}

Assistant:

static glu::MatrixOrder getMatrixOrderFromPath (const std::vector<VariablePathComponent>& path)
{
	glu::MatrixOrder order = glu::MATRIXORDER_LAST;

	// inherit majority
	for (int pathNdx = 0; pathNdx < (int)path.size(); ++pathNdx)
	{
		glu::MatrixOrder matOrder;

		if (path[pathNdx].isInterfaceBlock())
			matOrder = path[pathNdx].getInterfaceBlock()->layout.matrixOrder;
		else if (path[pathNdx].isDeclaration())
			matOrder = path[pathNdx].getDeclaration()->layout.matrixOrder;
		else if (path[pathNdx].isVariableType())
			matOrder = glu::MATRIXORDER_LAST;
		else
		{
			DE_ASSERT(false);
			return glu::MATRIXORDER_LAST;
		}

		if (matOrder != glu::MATRIXORDER_LAST)
			order = matOrder;
	}

	return order;
}